

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

size_t dlmalloc_set_footprint_limit(size_t bytes)

{
  size_t local_18;
  size_t result;
  size_t bytes_local;
  
  if (bytes == 0xffffffffffffffff) {
    local_18 = 0;
  }
  else {
    local_18 = bytes + (mparams.granularity - 1) & (mparams.granularity - 1 ^ 0xffffffffffffffff);
  }
  _gm_.footprint_limit = local_18;
  return local_18;
}

Assistant:

size_t dlmalloc_set_footprint_limit(size_t bytes) {
  size_t result;  /* invert sense of 0 */
  if (bytes == 0)
    result = granularity_align(1); /* Use minimal size */
  if (bytes == MAX_SIZE_T)
    result = 0;                    /* disable */
  else
    result = granularity_align(bytes);
  return gm->footprint_limit = result;
}